

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_bool nk_filter_hex(nk_text_edit *box,nk_rune unicode)

{
  return (nk_bool)((unicode & 0xffffffdf) - 0x41 < 6 || unicode - 0x30 < 10);
}

Assistant:

NK_API nk_bool
nk_filter_hex(const struct nk_text_edit *box, nk_rune unicode)
{
NK_UNUSED(box);
if ((unicode < '0' || unicode > '9') &&
(unicode < 'a' || unicode > 'f') &&
(unicode < 'A' || unicode > 'F'))
return nk_false;
else return nk_true;
}